

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

realtype N_VMinQuotient_Serial(N_Vector num,N_Vector denom)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  realtype rVar6;
  realtype rVar7;
  double dVar8;
  
  uVar1 = *num->content;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  bVar2 = true;
  rVar6 = 1.79769313486232e+308;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    dVar8 = *(double *)(*(long *)((long)denom->content + 8) + uVar5 * 8);
    if ((dVar8 != 0.0) || (rVar7 = rVar6, NAN(dVar8))) {
      dVar8 = *(double *)(*(long *)((long)num->content + 8) + uVar5 * 8) / dVar8;
      bVar3 = !bVar2;
      rVar7 = dVar8;
      bVar2 = false;
      if ((bVar3) && (rVar7 = rVar6, dVar8 <= rVar6)) {
        rVar7 = dVar8;
        bVar2 = false;
      }
    }
    rVar6 = rVar7;
  }
  return rVar6;
}

Assistant:

realtype N_VMinQuotient_Serial(N_Vector num, N_Vector denom)
{
  booleantype notEvenOnce;
  sunindextype i, N;
  realtype *nd, *dd, min;

  nd = dd = NULL;

  N  = NV_LENGTH_S(num);
  nd = NV_DATA_S(num);
  dd = NV_DATA_S(denom);

  notEvenOnce = SUNTRUE;
  min = BIG_REAL;

  for (i = 0; i < N; i++) {
    if (dd[i] == ZERO) continue;
    else {
      if (!notEvenOnce) min = SUNMIN(min, nd[i]/dd[i]);
      else {
	min = nd[i]/dd[i];
        notEvenOnce = SUNFALSE;
      }
    }
  }

  return(min);
}